

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RtreeSearchPoint * rtreeEnqueue(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  RtreeSearchPoint *pRVar1;
  int iVar2;
  RtreeSearchPoint *pRVar3;
  uint i;
  uint j;
  
  j = pCur->nPoint;
  if ((int)j < pCur->nPointAlloc) {
    pRVar3 = pCur->aPoint;
  }
  else {
    iVar2 = pCur->nPointAlloc * 2 + 8;
    pRVar3 = (RtreeSearchPoint *)sqlite3_realloc(pCur->aPoint,iVar2 * 0x18);
    if (pRVar3 == (RtreeSearchPoint *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    pCur->aPoint = pRVar3;
    pCur->nPointAlloc = iVar2;
    j = pCur->nPoint;
  }
  pCur->nPoint = j + 1;
  pRVar3[(int)j].rScore = rScore;
  pRVar3[(int)j].iLevel = iLevel;
  pRVar3 = pRVar3 + (int)j;
  while( true ) {
    if ((int)j < 1) {
      return pRVar3;
    }
    i = j - 1 >> 1;
    pRVar1 = pCur->aPoint;
    iVar2 = rtreeSearchPointCompare(pRVar3,pRVar1 + i);
    if (-1 < iVar2) break;
    rtreeSearchPointSwap(pCur,i,j);
    pRVar3 = pRVar1 + i;
    j = i;
  }
  return pRVar3;
}

Assistant:

static RtreeSearchPoint *rtreeEnqueue(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  int i, j;
  RtreeSearchPoint *pNew;
  if( pCur->nPoint>=pCur->nPointAlloc ){
    int nNew = pCur->nPointAlloc*2 + 8;
    pNew = sqlite3_realloc(pCur->aPoint, nNew*sizeof(pCur->aPoint[0]));
    if( pNew==0 ) return 0;
    pCur->aPoint = pNew;
    pCur->nPointAlloc = nNew;
  }
  i = pCur->nPoint++;
  pNew = pCur->aPoint + i;
  pNew->rScore = rScore;
  pNew->iLevel = iLevel;
  assert( iLevel<=RTREE_MAX_DEPTH );
  while( i>0 ){
    RtreeSearchPoint *pParent;
    j = (i-1)/2;
    pParent = pCur->aPoint + j;
    if( rtreeSearchPointCompare(pNew, pParent)>=0 ) break;
    rtreeSearchPointSwap(pCur, j, i);
    i = j;
    pNew = pParent;
  }
  return pNew;
}